

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMeshSurface.cpp
# Opt level: O2

void __thiscall chrono::fea::ChMeshSurface::AddFacesFromBoundary(ChMeshSurface *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  undefined8 uVar2;
  size_type sVar3;
  pointer psVar4;
  size_type sVar5;
  pointer psVar6;
  uint uVar7;
  int iVar8;
  ChMesh *pCVar9;
  int iVar10;
  shared_ptr<chrono::fea::ChElementHexahedron> mbrick;
  char local_1b4;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  shared_ptr<chrono::fea::ChElementTetrahedron> mtetra;
  array<chrono::fea::ChNodeFEAxyz_*,_3UL> mface_key;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  undefined1 local_148 [16];
  ChTetrahedronFace mface_1;
  ChHexahedronFace local_118;
  multimap<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>_>
  face_map_hex;
  __shared_ptr<chrono::ChLoadableUV,(__gnu_cxx::_Lock_policy)2> local_c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<chrono::ChLoadableUV,(__gnu_cxx::_Lock_policy)2> local_b0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2> local_70;
  multimap<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>_>
  face_map_tet;
  
  face_map_tet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &face_map_tet._M_t._M_impl.super__Rb_tree_header._M_header;
  this_00 = &mface_1.m_element.
             super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  uVar7 = 0;
  face_map_tet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  face_map_tet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  face_map_tet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  face_map_tet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       face_map_tet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    pCVar9 = this->mmesh;
    psVar6 = (pCVar9->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar4 = (pCVar9->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((uint)((ulong)((long)psVar6 - (long)psVar4) >> 4) <= uVar7) break;
    ChMesh::GetElement((ChMesh *)&mface_1,(uint)pCVar9);
    std::dynamic_pointer_cast<chrono::fea::ChElementTetrahedron,chrono::fea::ChElementBase>
              ((shared_ptr<chrono::fea::ChElementBase> *)
               &mtetra.
                super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mface_1.m_face_id);
    if (mtetra.super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      for (iVar10 = 0; iVar10 != 4; iVar10 = iVar10 + 1) {
        std::__shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_70,
                     &mtetra.
                      super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>
                    );
        ChTetrahedronFace::ChTetrahedronFace
                  ((ChTetrahedronFace *)&face_map_hex,
                   (shared_ptr<chrono::fea::ChElementTetrahedron> *)&local_70,(char)iVar10);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
        iVar8 = (int)(ChTetrahedronFace *)&face_map_hex;
        ChTetrahedronFace::GetNodeN(&mface_1,iVar8);
        mface_key._M_elems[0] = (ChNodeFEAxyz *)mface_1.super_ChLoadableUV;
        ChTetrahedronFace::GetNodeN((ChTetrahedronFace *)&mbrick,iVar8);
        mface_key._M_elems[1] =
             (ChNodeFEAxyz *)
             mbrick.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        ChTetrahedronFace::GetNodeN((ChTetrahedronFace *)local_1a8,iVar8);
        mface_key._M_elems[2] = (ChNodeFEAxyz *)local_1a8._0_8_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a8 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&mbrick.
                    super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mface_1.m_face_id);
        std::__sort<chrono::fea::ChNodeFEAxyz**,__gnu_cxx::__ops::_Iter_less_iter>
                  (&mface_key,&local_150);
        mface_1.m_element.
        super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)mface_key._M_elems[2];
        mface_1.super_ChLoadableUV = (ChLoadableUV)mface_key._M_elems[0];
        mface_1._8_8_ = mface_key._M_elems[1];
        ChTetrahedronFace::ChTetrahedronFace
                  ((ChTetrahedronFace *)this_00,(ChTetrahedronFace *)&face_map_hex);
        std::
        _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz*,3ul>,std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>,std::_Select1st<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>>,std::less<std::array<chrono::fea::ChNodeFEAxyz*,3ul>>,std::allocator<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>>>
        ::
        _M_insert_equal<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>>
                  ((_Rb_tree<std::array<chrono::fea::ChNodeFEAxyz*,3ul>,std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>,std::_Select1st<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>>,std::less<std::array<chrono::fea::ChNodeFEAxyz*,3ul>>,std::allocator<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>>>
                    *)&face_map_tet,
                   (pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>
                    *)&mface_1);
        ChTetrahedronFace::~ChTetrahedronFace((ChTetrahedronFace *)this_00);
        ChTetrahedronFace::~ChTetrahedronFace((ChTetrahedronFace *)&face_map_hex);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mtetra.
                super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar7 = uVar7 + 1;
  }
  for (uVar7 = 0; uVar7 < (uint)((ulong)((long)psVar6 - (long)psVar4) >> 4); uVar7 = uVar7 + 1) {
    ChMesh::GetElement((ChMesh *)&mface_1,(uint)pCVar9);
    std::dynamic_pointer_cast<chrono::fea::ChElementTetrahedron,chrono::fea::ChElementBase>
              ((shared_ptr<chrono::fea::ChElementBase> *)&mface_key);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mface_1.m_face_id);
    if (mface_key._M_elems[0] != (ChNodeFEAxyz *)0x0) {
      for (local_198._0_4_ = 0; (int)local_198._0_4_ < 4; local_198._0_4_ = local_198._0_4_ + 1) {
        std::__shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_80,
                     (__shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2> *)
                     &mface_key);
        ChTetrahedronFace::ChTetrahedronFace
                  (&mface_1,(shared_ptr<chrono::fea::ChElementTetrahedron> *)&local_80,local_198[0])
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
        iVar10 = (int)(ChMesh *)&mface_1;
        ChTetrahedronFace::GetNodeN((ChTetrahedronFace *)&mtetra,iVar10);
        face_map_hex._M_t._M_impl._0_8_ =
             mtetra.
             super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        ChTetrahedronFace::GetNodeN((ChTetrahedronFace *)&mbrick,iVar10);
        face_map_hex._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             mbrick.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        ChTetrahedronFace::GetNodeN((ChTetrahedronFace *)local_1a8,iVar10);
        face_map_hex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)local_1a8._0_8_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a8 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&mbrick.
                    super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&mtetra.
                    super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__sort<chrono::fea::ChNodeFEAxyz**,__gnu_cxx::__ops::_Iter_less_iter>
                  (&face_map_hex,&face_map_hex._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
        ;
        sVar3 = std::
                _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>_>
                ::count(&face_map_tet._M_t,(key_type *)&face_map_hex);
        if (sVar3 == 1) {
          std::
          make_shared<chrono::fea::ChTetrahedronFace,std::shared_ptr<chrono::fea::ChElementTetrahedron>&,int&>
                    (&mtetra,(int *)&mface_key);
          std::__shared_ptr<chrono::ChLoadableUV,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<chrono::fea::ChTetrahedronFace,void>
                    (local_b0,(__shared_ptr<chrono::fea::ChTetrahedronFace,_(__gnu_cxx::_Lock_policy)2>
                               *)&mtetra);
          (*this->_vptr_ChMeshSurface[2])(this,local_b0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&mtetra.
                      super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        ChTetrahedronFace::~ChTetrahedronFace(&mface_1);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(mface_key._M_elems + 1));
    pCVar9 = this->mmesh;
    psVar4 = (pCVar9->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar6 = (pCVar9->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  face_map_hex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &face_map_hex._M_t._M_impl.super__Rb_tree_header._M_header;
  face_map_hex._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       face_map_hex._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  face_map_hex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  face_map_hex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  face_map_hex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       face_map_hex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar7 = 0; uVar7 < (uint)((ulong)((long)psVar6 - (long)psVar4) >> 4); uVar7 = uVar7 + 1) {
    ChMesh::GetElement((ChMesh *)&mface_1,(uint)pCVar9);
    std::dynamic_pointer_cast<chrono::fea::ChElementHexahedron,chrono::fea::ChElementBase>
              ((shared_ptr<chrono::fea::ChElementBase> *)
               &mbrick.
                super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mface_1.m_face_id);
    if (mbrick.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      for (iVar10 = 0; iVar10 != 6; iVar10 = iVar10 + 1) {
        std::__shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_90,
                     &mbrick.
                      super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>
                    );
        ChHexahedronFace::ChHexahedronFace
                  ((ChHexahedronFace *)&mface_key,
                   (shared_ptr<chrono::fea::ChElementHexahedron> *)&local_90,(char)iVar10);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
        iVar8 = (int)(ChHexahedronFace *)&mface_key;
        ChHexahedronFace::GetNodeN((ChHexahedronFace *)&mface_1,iVar8);
        mtetra.super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)mface_1.super_ChLoadableUV;
        ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_1a8,iVar8);
        mtetra.super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._0_8_;
        ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_198,iVar8);
        peVar1 = (element_type *)CONCAT44(local_198._4_4_,local_198._0_4_);
        ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_148,iVar8);
        uVar2 = local_148._0_8_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a8 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mface_1.m_face_id);
        std::__sort<chrono::fea::ChNodeFEAxyz**,__gnu_cxx::__ops::_Iter_less_iter>
                  (&mtetra,&mface_key);
        mface_1.super_ChLoadableUV =
             (ChLoadableUV)
             mtetra.
             super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        mface_1._8_8_ =
             mtetra.
             super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        mface_1.m_element.
        super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
        mface_1.m_element.
        super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             peVar1;
        ChHexahedronFace::ChHexahedronFace(&local_118,(ChHexahedronFace *)&mface_key);
        std::
        _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz*,4ul>,std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>,std::_Select1st<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>>,std::less<std::array<chrono::fea::ChNodeFEAxyz*,4ul>>,std::allocator<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>>>
        ::
        _M_insert_equal<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>>
                  ((_Rb_tree<std::array<chrono::fea::ChNodeFEAxyz*,4ul>,std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>,std::_Select1st<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>>,std::less<std::array<chrono::fea::ChNodeFEAxyz*,4ul>>,std::allocator<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>>>
                    *)&face_map_hex,
                   (pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>
                    *)&mface_1);
        ChHexahedronFace::~ChHexahedronFace(&local_118);
        ChHexahedronFace::~ChHexahedronFace((ChHexahedronFace *)&mface_key);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mbrick.
                super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pCVar9 = this->mmesh;
    psVar4 = (pCVar9->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar6 = (pCVar9->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (uVar7 = 0; uVar7 < (uint)((ulong)((long)psVar6 - (long)psVar4) >> 4); uVar7 = uVar7 + 1) {
    ChMesh::GetElement((ChMesh *)&mface_1,(uint)pCVar9);
    std::dynamic_pointer_cast<chrono::fea::ChElementHexahedron,chrono::fea::ChElementBase>
              ((shared_ptr<chrono::fea::ChElementBase> *)&mtetra);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mface_1.m_face_id);
    if (mtetra.super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      for (iVar10 = 0; iVar10 < 6; iVar10 = iVar10 + 1) {
        std::__shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_a0,
                     (__shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2> *)
                     &mtetra);
        local_1b4 = (char)iVar10;
        ChHexahedronFace::ChHexahedronFace
                  ((ChHexahedronFace *)&mface_1,
                   (shared_ptr<chrono::fea::ChElementHexahedron> *)&local_a0,local_1b4);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
        iVar8 = (int)(ChMesh *)&mface_1;
        ChHexahedronFace::GetNodeN((ChHexahedronFace *)&mbrick,iVar8);
        mface_key._M_elems[0] =
             (ChNodeFEAxyz *)
             mbrick.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_1a8,iVar8);
        mface_key._M_elems[1] = (ChNodeFEAxyz *)local_1a8._0_8_;
        ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_198,iVar8);
        mface_key._M_elems[2] = (ChNodeFEAxyz *)CONCAT44(local_198._4_4_,local_198._0_4_);
        ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_148,iVar8);
        local_150._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._0_8_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a8 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&mbrick.
                    super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__sort<chrono::fea::ChNodeFEAxyz**,__gnu_cxx::__ops::_Iter_less_iter>
                  ((key_type *)&mface_key,local_148);
        sVar5 = std::
                _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>_>
                ::count(&face_map_hex._M_t,(key_type *)&mface_key);
        if (sVar5 == 1) {
          std::
          make_shared<chrono::fea::ChHexahedronFace,std::shared_ptr<chrono::fea::ChElementHexahedron>&,int&>
                    (&mbrick,(int *)&mtetra);
          std::__shared_ptr<chrono::ChLoadableUV,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<chrono::fea::ChHexahedronFace,void>
                    (local_c0,(__shared_ptr<chrono::fea::ChHexahedronFace,_(__gnu_cxx::_Lock_policy)2>
                               *)&mbrick);
          (*this->_vptr_ChMeshSurface[2])(this,local_c0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&mbrick.
                      super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        ChHexahedronFace::~ChHexahedronFace((ChHexahedronFace *)&mface_1);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mtetra.
                super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pCVar9 = this->mmesh;
    psVar4 = (pCVar9->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar6 = (pCVar9->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  std::
  _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>_>
  ::~_Rb_tree(&face_map_hex._M_t);
  std::
  _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>_>
  ::~_Rb_tree(&face_map_tet._M_t);
  return;
}

Assistant:

void ChMeshSurface::AddFacesFromBoundary() {
    // Boundary faces of TETRAHEDRONS
    std::multimap<std::array<ChNodeFEAxyz*, 3>, ChTetrahedronFace> face_map_tet;

    for (unsigned int ie = 0; ie < this->mmesh->GetNelements(); ++ie) {
        if (auto mtetra = std::dynamic_pointer_cast<ChElementTetrahedron>(mmesh->GetElement(ie))) {
            for (int nface = 0; nface < 4; ++nface) {
                ChTetrahedronFace mface(mtetra, nface);
                std::array<ChNodeFEAxyz*, 3> mface_key = {mface.GetNodeN(0).get(), mface.GetNodeN(1).get(),
                                                          mface.GetNodeN(2).get()};
                std::sort(mface_key.begin(), mface_key.end());
                face_map_tet.insert({mface_key, mface});
            }
        }
    }
    for (unsigned int ie = 0; ie < this->mmesh->GetNelements(); ++ie) {
        if (auto mtetra = std::dynamic_pointer_cast<ChElementTetrahedron>(mmesh->GetElement(ie))) {
            for (int nface = 0; nface < 4; ++nface) {
                ChTetrahedronFace mface(mtetra, nface);
                std::array<ChNodeFEAxyz*, 3> mface_key = {mface.GetNodeN(0).get(), mface.GetNodeN(1).get(),
                                                          mface.GetNodeN(2).get()};
                std::sort(mface_key.begin(), mface_key.end());
                if (face_map_tet.count(mface_key) == 1) {
                    // Found a face that is not shared.. so it is a boundary face.
                    // Instance it to be handled via shared ptr, and add it to list...
                    auto boundary_face = chrono_types::make_shared<ChTetrahedronFace>(mtetra, nface);
                    this->AddFace(boundary_face);
                }
            }
        }
    }

    // Boundary faces of HEXAHEDRONS
    std::multimap<std::array<ChNodeFEAxyz*, 4>, ChHexahedronFace> face_map_hex;

    for (unsigned int ie = 0; ie < mmesh->GetNelements(); ++ie) {
        if (auto mbrick = std::dynamic_pointer_cast<ChElementHexahedron>(mmesh->GetElement(ie))) {
            for (int nface = 0; nface < 6; ++nface) {
                ChHexahedronFace mface(mbrick, nface);
                std::array<ChNodeFEAxyz*, 4> mface_key = {mface.GetNodeN(0).get(), mface.GetNodeN(1).get(),
                                                          mface.GetNodeN(2).get(), mface.GetNodeN(3).get()};
                std::sort(mface_key.begin(), mface_key.end());
                face_map_hex.insert({mface_key, mface});
            }
        }
    }
    for (unsigned int ie = 0; ie < mmesh->GetNelements(); ++ie) {
        if (auto mbrick = std::dynamic_pointer_cast<ChElementHexahedron>(mmesh->GetElement(ie))) {
            for (int nface = 0; nface < 6; ++nface) {
                ChHexahedronFace mface(mbrick, nface);
                std::array<ChNodeFEAxyz*, 4> mface_key = {mface.GetNodeN(0).get(), mface.GetNodeN(1).get(),
                                                          mface.GetNodeN(2).get(), mface.GetNodeN(3).get()};
                std::sort(mface_key.begin(), mface_key.end());
                if (face_map_hex.count(mface_key) == 1) {
                    // Found a face that is not shared.. so it is a boundary face.
                    // Instance it to be handled via shared ptr, and add it to list...
                    auto boundary_face = chrono_types::make_shared<ChHexahedronFace>(mbrick, nface);
                    this->AddFace(boundary_face);
                }
            }
        }
    }
}